

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::JoinHashTable::ScanStructure::NextSingleJoin
          (ScanStructure *this,DataChunk *keys,DataChunk *left,DataChunk *result)

{
  sel_t *psVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  column_t column_id;
  idx_t iVar3;
  reference pvVar4;
  reference other;
  const_reference pvVar5;
  pointer this_00;
  JoinHashTable *pJVar6;
  InvalidInputException *this_01;
  size_type __n;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  size_type __n_00;
  idx_t iVar10;
  SelectionVector result_sel;
  string local_50;
  
  SelectionVector::SelectionVector(&result_sel,0x800);
  if (this->count == 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    do {
      iVar3 = ResolvePredicates(this,keys,&this->chain_match_sel_vector,
                                &this->chain_no_match_sel_vector);
      iVar10 = this->count;
      if (iVar3 != 0) {
        psVar1 = (this->chain_match_sel_vector).sel_vector;
        _Var2._M_head_impl =
             (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        iVar7 = 0;
        do {
          iVar8 = iVar7;
          if (psVar1 != (sel_t *)0x0) {
            iVar8 = (idx_t)psVar1[iVar7];
          }
          _Var2._M_head_impl[iVar8] = true;
          result_sel.sel_vector[iVar9 + iVar7] = (sel_t)iVar8;
          iVar7 = iVar7 + 1;
        } while (iVar3 != iVar7);
        iVar9 = iVar9 + iVar7;
      }
      AdvancePointers(this,&this->chain_no_match_sel_vector,iVar10 - iVar3);
    } while (this->count != 0);
  }
  if ((left->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (left->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar4 = vector<duckdb::Vector,_true>::operator[](&result->data,__n_00);
      other = vector<duckdb::Vector,_true>::operator[](&left->data,__n_00);
      Vector::Reference(pvVar4,other);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(left->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(left->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  pJVar6 = this->ht;
  if ((pJVar6->output_columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pJVar6->output_columns->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar4 = vector<duckdb::Vector,_true>::operator[]
                         (&result->data,
                          ((long)(left->data).
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(left->data).
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5 + __n);
      if (left->count != 0) {
        iVar10 = 0;
        do {
          if ((this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
              super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
              super__Head_base<0UL,_bool_*,_false>._M_head_impl[iVar10] == false) {
            FlatVector::SetNull(pvVar4,iVar10,true);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < left->count);
      }
      pvVar5 = vector<unsigned_long,_true>::operator[](this->ht->output_columns,__n);
      column_id = *pvVar5;
      this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                ::operator->(&this->ht->data_collection);
      TupleDataCollection::Gather
                (this_00,&this->pointers,&result_sel,iVar9,column_id,pvVar4,&result_sel,
                 (optional_ptr<duckdb::Vector,_true>)0x0);
      __n = __n + 1;
      pJVar6 = this->ht;
    } while (__n < (ulong)((long)(pJVar6->output_columns->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pJVar6->output_columns->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  result->count = left->count;
  this->finished = true;
  if ((pJVar6->single_join_error_on_multiple_rows == true) && (iVar9 != 0)) {
    AdvancePointers(this,&result_sel,iVar9);
    iVar9 = ResolvePredicates(this,keys,&this->chain_match_sel_vector,(SelectionVector *)0x0);
    if (iVar9 != 0) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "More than one row returned by a subquery used as an expression - scalar subqueries can only return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to previous behavior of returning a random row."
                 ,"");
      InvalidInputException::InvalidInputException(this_01,&local_50);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this->count = 0;
  }
  if (result_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (result_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void ScanStructure::NextSingleJoin(DataChunk &keys, DataChunk &left, DataChunk &result) {
	// single join
	// this join is similar to the semi join except that
	// (1) we actually return data from the RHS and
	// (2) we return NULL for that data if there is no match
	// (3) if single_join_error_on_multiple_rows is set, we need to keep looking for duplicates after fetching
	idx_t result_count = 0;
	SelectionVector result_sel(STANDARD_VECTOR_SIZE);

	while (this->count > 0) {
		// resolve the equality_predicates for the current set of pointers
		idx_t match_count = ResolvePredicates(keys, chain_match_sel_vector, &chain_no_match_sel_vector);
		idx_t no_match_count = this->count - match_count;

		// mark each of the matches as found
		for (idx_t i = 0; i < match_count; i++) {
			// found a match for this index
			auto index = chain_match_sel_vector.get_index(i);
			found_match[index] = true;
			result_sel.set_index(result_count++, index);
		}
		// continue searching for the ones where we did not find a match yet
		AdvancePointers(chain_no_match_sel_vector, no_match_count);
	}
	// reference the columns of the left side from the result
	D_ASSERT(left.ColumnCount() > 0);
	for (idx_t i = 0; i < left.ColumnCount(); i++) {
		result.data[i].Reference(left.data[i]);
	}
	// now fetch the data from the RHS
	for (idx_t i = 0; i < ht.output_columns.size(); i++) {
		auto &vector = result.data[left.ColumnCount() + i];
		// set NULL entries for every entry that was not found
		for (idx_t j = 0; j < left.size(); j++) {
			if (!found_match[j]) {
				FlatVector::SetNull(vector, j, true);
			}
		}
		const auto output_col_idx = ht.output_columns[i];
		D_ASSERT(vector.GetType() == ht.layout_ptr->GetTypes()[output_col_idx]);
		GatherResult(vector, result_sel, result_sel, result_count, output_col_idx);
	}
	result.SetCardinality(left.size());

	// like the SEMI, ANTI and MARK join types, the SINGLE join only ever does one pass over the HT per input chunk
	finished = true;

	if (ht.single_join_error_on_multiple_rows && result_count > 0) {
		// we need to throw an error if there are multiple rows per key
		// advance pointers for those rows
		AdvancePointers(result_sel, result_count);

		// now resolve the predicates
		idx_t match_count = ResolvePredicates(keys, chain_match_sel_vector, nullptr);
		if (match_count > 0) {
			// we found at least one duplicate row - throw
			throw InvalidInputException(
			    "More than one row returned by a subquery used as an expression - scalar subqueries can only "
			    "return a single row.\n\nUse \"SET scalar_subquery_error_on_multiple_rows=false\" to revert to "
			    "previous behavior of returning a random row.");
		}

		this->count = 0;
	}
}